

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
anon_unknown.dwarf_4ccef::CliqueRunner::unpermute
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CliqueRunner *this,
          vector<int,_std::allocator<int>_> *v)

{
  int *piVar1;
  int *w;
  int *piVar2;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,
               (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto unpermute(
            const vector<int> & v) -> vector<int>
        {
            vector<int> result;
            for (auto & w : v)
                result.push_back(order[w]);
            return result;
        }